

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O2

void __thiscall
TEST_MockPlugin_installCopierRecordsTheCopierButNotInstallsItYet_TestShell::
~TEST_MockPlugin_installCopierRecordsTheCopierButNotInstallsItYet_TestShell
          (TEST_MockPlugin_installCopierRecordsTheCopierButNotInstallsItYet_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockPlugin, installCopierRecordsTheCopierButNotInstallsItYet)
{
    MockFailureReporterInstaller failureReporterInstaller;

    DummyCopier copier;
    plugin.installCopier("myType", copier);
    mock().expectOneCall("foo").withOutputParameterOfTypeReturning("myType", "name", NULLPTR);
    mock().actualCall("foo").withOutputParameterOfType("myType", "name", NULLPTR);

    MockNoWayToCopyCustomTypeFailure failure(test, "myType");
    CHECK_EXPECTED_MOCK_FAILURE(failure);

    plugin.clear();
}